

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Races.cpp
# Opt level: O0

map<int,_std::shared_ptr<Race>,_std::less<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<Race>_>_>_>
* __thiscall
Races::EnumerateRaces
          (map<int,_std::shared_ptr<Race>,_std::less<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<Race>_>_>_>
           *__return_storage_ptr__,Races *this)

{
  bool bVar1;
  reference ppVar2;
  mapped_type *this_00;
  undefined1 local_98 [8];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Race>_>
  race;
  iterator __end1;
  iterator __begin1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Race>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Race>_>_>_>
  *__range1;
  int count;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Race>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Race>_>_>_>
  races;
  Races *this_local;
  map<int,_std::shared_ptr<Race>,_std::less<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<Race>_>_>_>
  *race_map;
  
  races._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)this;
  GetRaces_abi_cxx11_((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Race>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Race>_>_>_>
                       *)&count,this);
  __range1._7_1_ = 0;
  std::
  map<int,_std::shared_ptr<Race>,_std::less<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<Race>_>_>_>
  ::map(__return_storage_ptr__);
  __range1._0_4_ = 0;
  __end1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Race>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Race>_>_>_>
           ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Race>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Race>_>_>_>
                    *)&count);
  race.second.super___shared_ptr<Race,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Race>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Race>_>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Race>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Race>_>_>_>
              *)&count);
  while (bVar1 = std::operator!=(&__end1,(_Self *)&race.second.
                                                                                                      
                                                  super___shared_ptr<Race,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount), bVar1) {
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Race>_>_>
             ::operator*(&__end1);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Race>_>
    ::pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Race>_>
            *)local_98,ppVar2);
    __range1._0_4_ = (int)__range1 + 1;
    this_00 = std::
              map<int,_std::shared_ptr<Race>,_std::less<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<Race>_>_>_>
              ::operator[](__return_storage_ptr__,(key_type *)&__range1);
    std::shared_ptr<Race>::operator=(this_00,(shared_ptr<Race> *)&race.field_0x18);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Race>_>
    ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Race>_>
             *)local_98);
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Race>_>_>
    ::operator++(&__end1);
  }
  __range1._7_1_ = 1;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Race>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Race>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Race>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Race>_>_>_>
          *)&count);
  return __return_storage_ptr__;
}

Assistant:

std::map<int, std::shared_ptr<Race>> Races::EnumerateRaces() {
    auto races = GetRaces();
    std::map<int, std::shared_ptr<Race>> race_map;
    int count = 0;
    for(auto race : races) {
        count++;
        race_map[count] = race.second;
    }
    return race_map;
}